

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O1

char * __thiscall FSerializer::GetKey(FSerializer *this)

{
  FReader *pFVar1;
  FJSONObject *pFVar2;
  Value *pVVar3;
  Pointer this_00;
  Ch *pCVar4;
  uint uVar5;
  
  if (this->w == (FWriter *)0x0) {
    pFVar1 = this->r;
    pFVar2 = (pFVar1->mObjects).Array;
    uVar5 = (pFVar1->mObjects).Count - 1;
    pVVar3 = pFVar2[uVar5].mObject;
    if ((pVVar3->data_).f.flags == 3) {
      this_00 = pFVar2[uVar5].mIterator.ptr_;
      if (this_00 != (Pointer)((pVVar3->data_).s.str + (ulong)(pVVar3->data_).s.length * 0x30)) {
        pFVar1->mKeyValue = &this_00->value;
        pFVar2[uVar5].mIterator.ptr_ = this_00 + 1;
        pCVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(&this_00->name);
        return pCVar4;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

bool isWriting() const
	{
		return w != nullptr;
	}